

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O2

void __thiscall avro::Validator::setupOperation(Validator *this,NodePtr *node)

{
  Type type;
  NodePtr actualNode;
  CompoundType local_30;
  
  type = node->px->type_;
  this->nextType_ = type;
  if (type == AVRO_NUM_TYPES) {
    resolveSymbol((avro *)&local_30,node);
    setupOperation(this,&local_30.node);
    boost::detail::shared_count::~shared_count(&local_30.node.pn);
  }
  else {
    setupFlag(this,type);
    if (7 < (uint)this->nextType_) {
      local_30.node.px = node->px;
      local_30.node.pn.pi_ = (node->pn).pi_;
      if (local_30.node.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_30.node.pn.pi_)->use_count_ = (local_30.node.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_30.pos = 0;
      std::vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
      emplace_back<avro::Validator::CompoundType>(&this->compoundStack_,&local_30);
      boost::detail::shared_count::~shared_count(&local_30.node.pn);
      this->compoundStarted_ = true;
    }
  }
  return;
}

Assistant:

void
Validator::setupOperation(const NodePtr &node)
{
    nextType_ = node->type();

    if(nextType_ == AVRO_SYMBOLIC) {
        NodePtr actualNode = resolveSymbol(node);
        assert(actualNode);
        setupOperation(actualNode);
        return;
    }

    assert(nextType_ < AVRO_SYMBOLIC);

    setupFlag(nextType_);

    if(!isPrimitive(nextType_)) {
        compoundStack_.push_back(CompoundType(node));
        compoundStarted_ = true;
    }
}